

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::convert_packing(Mat *src,Mat *dst,int _elempack,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  ParamDict local_40;
  
  pLVar1 = create_layer(0x3e);
  ParamDict::ParamDict(&local_40);
  ParamDict::set(&local_40,0,_elempack);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&local_40);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&local_40);
  return;
}

Assistant:

void convert_packing(const Mat& src, Mat& dst, int _elempack, const Option& opt)
{
    Layer* packing = create_layer(LayerType::Packing);

    ParamDict pd;
    pd.set(0, _elempack);

    packing->load_param(pd);

    packing->create_pipeline(opt);

    packing->forward(src, dst, opt);

    packing->destroy_pipeline(opt);

    delete packing;
}